

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateFeatureDescription
                   (Result *__return_storage_ptr__,FeatureDescription *desc,int modelVersion,
                   bool isInput)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  RepeatedField<long> *this;
  uint32 uVar5;
  Rep *pRVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined8 *puVar11;
  ArrayFeatureType *pAVar12;
  SequenceFeatureType *pSVar13;
  ImageFeatureType *pIVar14;
  ArrayFeatureType *pAVar15;
  string *psVar16;
  Type *pTVar17;
  long lVar18;
  ImageFeatureType_ImageSizeRange *pIVar19;
  ImageFeatureType_EnumeratedImageSizes *pIVar20;
  Type *pTVar21;
  ArrayFeatureType_EnumeratedShapes *pAVar22;
  long *plVar23;
  undefined8 *puVar24;
  void **ppvVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  FeatureType *pFVar29;
  RepeatedField<long> *this_00;
  uint uVar30;
  uint64 __val;
  bool bVar31;
  SizeRange *pSVar32;
  pointer pcVar33;
  undefined8 uVar34;
  _Alloc_hider _Var35;
  uint64 __val_00;
  uint64 uVar36;
  uint uVar37;
  bool bVar38;
  Result res;
  string __str_2;
  string __str;
  string __str_1;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  undefined1 local_160 [24];
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  undefined1 local_138 [24];
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  Result *local_c0;
  char local_b5;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  FeatureType *local_70;
  SizeRange *local_68;
  ulong local_60;
  string local_58;
  ArrayFeatureType_EnumeratedShapes *local_38;
  
  uVar27 = (ulong)(uint)modelVersion;
  iVar9 = std::__cxx11::string::compare((char *)(desc->name_).ptr_);
  if (iVar9 == 0) {
    local_170 = (undefined1  [8])local_160;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,"Feature description must have a non-empty name.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
    local_b0.field_2._M_allocated_capacity = local_160._0_8_;
    local_b0._M_dataplus._M_p = (pointer)local_170;
    if (local_170 == (undefined1  [8])local_160) {
      return __return_storage_ptr__;
    }
    goto LAB_00294add;
  }
  pFVar29 = desc->type_;
  if (desc == (FeatureDescription *)&Specification::_FeatureDescription_default_instance_ ||
      pFVar29 == (FeatureType *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "Feature description ",(desc->name_).ptr_);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
    local_170 = (undefined1  [8])local_160;
    puVar24 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_160._0_8_ = *puVar24;
      local_160._8_8_ = puVar11[3];
    }
    else {
      local_160._0_8_ = *puVar24;
      local_170 = (undefined1  [8])*puVar11;
    }
    local_168._M_p = (pointer)puVar11[1];
    *puVar11 = puVar24;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
  }
  else {
    switch(pFVar29->_oneof_case_[0]) {
    case 0:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     "Feature description has an unspecified or invalid type for feature \'",
                     (desc->name_).ptr_);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
      local_170 = (undefined1  [8])local_160;
      puVar24 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_160._0_8_ = *puVar24;
        local_160._8_8_ = puVar11[3];
      }
      else {
        local_160._0_8_ = *puVar24;
        local_170 = (undefined1  [8])*puVar11;
      }
      local_168._M_p = (pointer)puVar11[1];
      *puVar11 = puVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
      break;
    default:
      goto switchD_00294994_caseD_1;
    case 4:
      __val_00 = ((pFVar29->Type_).imagetype_)->width_;
      if (pFVar29->_oneof_case_[0] == 4) {
        pIVar14 = (pFVar29->Type_).imagetype_;
        local_c0 = __return_storage_ptr__;
        local_60 = uVar27;
      }
      else {
        local_c0 = __return_storage_ptr__;
        local_60 = uVar27;
        pIVar14 = Specification::ImageFeatureType::default_instance();
      }
      __val = pIVar14->height_;
      __return_storage_ptr__ = local_c0;
      if (2 < (int)local_60) {
        if (pFVar29->_oneof_case_[0] == 4) {
          pIVar14 = (pFVar29->Type_).imagetype_;
        }
        else {
          pIVar14 = Specification::ImageFeatureType::default_instance();
        }
        __return_storage_ptr__ = local_c0;
        if (pIVar14->_oneof_case_[0] == 0x1f) {
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar14 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar14 = Specification::ImageFeatureType::default_instance();
          }
          __return_storage_ptr__ = local_c0;
          if (pIVar14->_oneof_case_[0] == 0x1f) {
            pIVar19 = (pIVar14->SizeFlexibility_).imagesizerange_;
          }
          else {
            pIVar19 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
          }
          pSVar32 = pIVar19->widthrange_;
          if (pSVar32 == (SizeRange *)0x0) {
            pSVar32 = (SizeRange *)&Specification::_SizeRange_default_instance_;
          }
          local_70 = pFVar29;
          validateSizeRange((Result *)local_170,pSVar32);
          bVar8 = Result::good((Result *)local_170);
          if (bVar8) {
            if (local_70->_oneof_case_[0] == 4) {
              pIVar14 = (local_70->Type_).imagetype_;
            }
            else {
              pIVar14 = Specification::ImageFeatureType::default_instance();
            }
            if (pIVar14->_oneof_case_[0] == 0x1f) {
              pIVar19 = (pIVar14->SizeFlexibility_).imagesizerange_;
            }
            else {
              pIVar19 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
            }
            local_68 = pIVar19->heightrange_;
            if (local_68 == (SizeRange *)0x0) {
              local_68 = (SizeRange *)&Specification::_SizeRange_default_instance_;
            }
            validateSizeRange((Result *)local_148,local_68);
            local_170 = local_148;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_140);
            if (local_140._M_p != local_138 + 8) {
              operator_delete(local_140._M_p,local_138._8_8_ + 1);
            }
            bVar8 = Result::good((Result *)local_170);
            if (!bVar8) {
              std::operator+(&local_100,"Description of image feature \'",(desc->name_).ptr_);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              puVar24 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_120.field_2._M_allocated_capacity = *puVar24;
                local_120.field_2._8_8_ = puVar11[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *puVar24;
                local_120._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_120._M_string_length = puVar11[1];
              *puVar11 = puVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              psVar16 = Result::message_abi_cxx11_((Result *)local_170);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_148,&local_120,psVar16);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_148);
              goto LAB_002968c0;
            }
            uVar36 = pSVar32->lowerbound_;
            if (0 < (long)__val_00 && 0 < (long)__val) {
              if (((long)__val_00 < (long)uVar36) ||
                 ((-1 < pSVar32->upperbound_ && (pSVar32->upperbound_ < (long)__val_00)))) {
                std::operator+(&local_e0,"Description of image feature \'",(desc->name_).ptr_);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_100.field_2._M_allocated_capacity = *puVar24;
                  local_100.field_2._8_8_ = puVar11[3];
                }
                else {
                  local_100.field_2._M_allocated_capacity = *puVar24;
                  local_100._M_dataplus._M_p = (pointer)*puVar11;
                }
                local_100._M_string_length = puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                std::__cxx11::to_string(&local_b0,__val_00);
                std::operator+(&local_120,&local_100,&local_b0);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
                local_148 = (undefined1  [8])local_138;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_138._0_8_ = *puVar24;
                  local_138._8_8_ = puVar11[3];
                }
                else {
                  local_138._0_8_ = *puVar24;
                  local_148 = (undefined1  [8])*puVar11;
                }
                local_140._M_p = (pointer)puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_148);
              }
              else {
                if ((long)local_68->lowerbound_ <= (long)__val) {
                  bVar8 = true;
                  uVar36 = __val_00;
                  if ((local_68->upperbound_ < 0) || ((long)__val <= local_68->upperbound_))
                  goto LAB_00296915;
                }
                std::operator+(&local_e0,"Description of image feature \'",(desc->name_).ptr_);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_100.field_2._M_allocated_capacity = *puVar24;
                  local_100.field_2._8_8_ = puVar11[3];
                }
                else {
                  local_100.field_2._M_allocated_capacity = *puVar24;
                  local_100._M_dataplus._M_p = (pointer)*puVar11;
                }
                local_100._M_string_length = puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                std::__cxx11::to_string(&local_b0,__val);
                std::operator+(&local_120,&local_100,&local_b0);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
                local_148 = (undefined1  [8])local_138;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_138._0_8_ = *puVar24;
                  local_138._8_8_ = puVar11[3];
                }
                else {
                  local_138._0_8_ = *puVar24;
                  local_148 = (undefined1  [8])*puVar11;
                }
                local_140._M_p = (pointer)puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_148);
              }
              if (local_148 != (undefined1  [8])local_138) {
                operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                (ulong)(local_120.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,
                                (ulong)(local_b0.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                (ulong)(local_100.field_2._M_allocated_capacity + 1));
              }
              uVar34 = local_e0.field_2._M_allocated_capacity;
              _Var35._M_p = local_e0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_0029690b;
              goto LAB_00296913;
            }
            __val = local_68->lowerbound_;
            bVar8 = true;
          }
          else {
            std::operator+(&local_100,"Description of image feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_120.field_2._M_allocated_capacity = *puVar24;
              local_120.field_2._8_8_ = puVar11[3];
            }
            else {
              local_120.field_2._M_allocated_capacity = *puVar24;
              local_120._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_120._M_string_length = puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            psVar16 = Result::message_abi_cxx11_((Result *)local_170);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,&local_120,psVar16);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_148);
LAB_002968c0:
            if (local_148 != (undefined1  [8])local_138) {
              operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,
                              (ulong)(local_120.field_2._M_allocated_capacity + 1));
            }
            uVar34 = local_100.field_2._M_allocated_capacity;
            _Var35._M_p = local_100._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
LAB_0029690b:
              operator_delete(_Var35._M_p,(ulong)(uVar34 + 1));
            }
LAB_00296913:
            bVar8 = false;
            uVar36 = __val_00;
          }
LAB_00296915:
          if (local_168._M_p != local_160 + 8) {
            operator_delete(local_168._M_p,(ulong)(local_160._8_8_ + 1));
          }
          pFVar29 = local_70;
          __val_00 = uVar36;
          if (!bVar8) {
            return __return_storage_ptr__;
          }
        }
        else if (pIVar14->_oneof_case_[0] == 0x15) {
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar14 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar14 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar14->_oneof_case_[0] == 0x15) {
            pIVar20 = (pIVar14->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            pIVar20 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
          }
          if ((pIVar20->sizes_).super_RepeatedPtrFieldBase.current_size_ == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,"Description of image feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
            local_170 = (undefined1  [8])local_160;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
            break;
          }
          if (0 < (long)__val_00 && 0 < (long)__val) {
            if (pFVar29->_oneof_case_[0] == 4) {
              pIVar14 = (pFVar29->Type_).imagetype_;
            }
            else {
              pIVar14 = Specification::ImageFeatureType::default_instance();
            }
            if (pIVar14->_oneof_case_[0] == 0x15) {
              pIVar20 = (pIVar14->SizeFlexibility_).enumeratedsizes_;
            }
            else {
              pIVar20 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
            }
            pRVar6 = (pIVar20->sizes_).super_RepeatedPtrFieldBase.rep_;
            ppvVar25 = pRVar6->elements;
            if (pRVar6 == (Rep *)0x0) {
              ppvVar25 = (void **)0x0;
            }
            lVar18 = (long)(pIVar20->sizes_).super_RepeatedPtrFieldBase.current_size_;
            if (lVar18 != 0) {
              lVar28 = 0;
              bVar8 = false;
              do {
                if (__val_00 == *(uint64 *)(*(long *)((long)ppvVar25 + lVar28) + 0x10)) {
                  bVar38 = true;
                  bVar31 = true;
                  if (__val != *(uint64 *)(*(long *)((long)ppvVar25 + lVar28) + 0x18))
                  goto LAB_00296404;
                }
                else {
LAB_00296404:
                  bVar38 = false;
                  bVar31 = bVar8;
                }
              } while ((!bVar38) &&
                      (bVar38 = lVar18 * 8 + -8 != lVar28, lVar28 = lVar28 + 8, bVar8 = bVar31,
                      bVar38));
              if (bVar31) goto LAB_00294e32;
            }
            std::operator+(&local_b0,"Description of image feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_e0.field_2._M_allocated_capacity = *puVar24;
              local_e0.field_2._8_8_ = puVar11[3];
            }
            else {
              local_e0.field_2._M_allocated_capacity = *puVar24;
              local_e0._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_e0._M_string_length = puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::to_string(&local_90,__val_00);
            std::operator+(&local_100,&local_e0,&local_90);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_120.field_2._M_allocated_capacity = *puVar24;
              local_120.field_2._8_8_ = puVar11[3];
            }
            else {
              local_120.field_2._M_allocated_capacity = *puVar24;
              local_120._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_120._M_string_length = puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::to_string(&local_58,__val);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,&local_120,&local_58);
            puVar11 = (undefined8 *)std::__cxx11::string::append(local_148);
            local_170 = (undefined1  [8])local_160;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
            goto LAB_00296fa8;
          }
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar14 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar14 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar14->_oneof_case_[0] == 0x15) {
            pIVar20 = (pIVar14->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            pIVar20 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
          }
          pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                              (&(pIVar20->sizes_).super_RepeatedPtrFieldBase,0);
          __val_00 = pTVar21->width_;
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar14 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar14 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar14->_oneof_case_[0] == 0x15) {
            pIVar20 = (pIVar14->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            pIVar20 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
          }
          pTVar21 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                              (&(pIVar20->sizes_).super_RepeatedPtrFieldBase,0);
          __val = pTVar21->height_;
        }
      }
LAB_00294e32:
      if ((long)__val_00 < 1) {
        std::operator+(&local_100,"Description of image feature \'",(desc->name_).ptr_);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        puVar24 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_120.field_2._M_allocated_capacity = *puVar24;
          local_120.field_2._8_8_ = puVar11[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *puVar24;
          local_120._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_120._M_string_length = puVar11[1];
        *puVar11 = puVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        if (pFVar29->_oneof_case_[0] == 4) {
          pIVar14 = (pFVar29->Type_).imagetype_;
        }
        else {
          pIVar14 = Specification::ImageFeatureType::default_instance();
        }
        __return_storage_ptr__ = local_c0;
        std::__cxx11::to_string(&local_e0,pIVar14->width_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,&local_120,&local_e0);
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_148);
        local_170 = (undefined1  [8])local_160;
        puVar24 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_160._0_8_ = *puVar24;
          local_160._8_8_ = puVar11[3];
        }
        else {
          local_160._0_8_ = *puVar24;
          local_170 = (undefined1  [8])*puVar11;
        }
        local_168._M_p = (pointer)puVar11[1];
        *puVar11 = puVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
      }
      else {
        if (0 < (long)__val) {
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar14 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar14 = Specification::ImageFeatureType::default_instance();
          }
          iVar9 = pIVar14->colorspace_;
          if (iVar9 < 0x1e) {
            if ((iVar9 == 10) || (iVar9 == 0x14)) {
switchD_00294994_caseD_1:
              Result::Result(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
          }
          else {
            if (iVar9 == 0x1e) goto switchD_00294994_caseD_1;
            if (iVar9 == 0x28) {
              iVar9 = (int)local_60;
              if (6 < iVar9) goto switchD_00294994_caseD_1;
              std::__cxx11::to_string(&local_120,7);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
              local_148 = (undefined1  [8])local_138;
              puVar24 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_138._0_8_ = *puVar24;
                local_138._8_8_ = puVar11[3];
              }
              else {
                local_138._0_8_ = *puVar24;
                local_148 = (undefined1  [8])*puVar11;
              }
              local_140._M_p = (pointer)puVar11[1];
              *puVar11 = puVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::to_string(&local_100,iVar9);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_170,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_148,&local_100);
              std::operator+(&local_b0,"Description of image feature \'",(desc->name_).ptr_);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              puVar24 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_e0.field_2._M_allocated_capacity = *puVar24;
                local_e0.field_2._8_8_ = puVar11[3];
              }
              else {
                local_e0.field_2._M_allocated_capacity = *puVar24;
                local_e0._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_e0._M_string_length = puVar11[1];
              *puVar11 = puVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              psVar16 = (string *)
                        std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_170);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar16);
              goto LAB_002973c0;
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,"Description of image feature \'",(desc->name_).ptr_);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
          local_170 = (undefined1  [8])local_160;
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_160._0_8_ = *puVar24;
            local_160._8_8_ = puVar11[3];
          }
          else {
            local_160._0_8_ = *puVar24;
            local_170 = (undefined1  [8])*puVar11;
          }
          local_168._M_p = (pointer)puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
          break;
        }
        std::operator+(&local_100,"Description of image feature \'",(desc->name_).ptr_);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        puVar24 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_120.field_2._M_allocated_capacity = *puVar24;
          local_120.field_2._8_8_ = puVar11[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *puVar24;
          local_120._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_120._M_string_length = puVar11[1];
        *puVar11 = puVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        if (pFVar29->_oneof_case_[0] == 4) {
          pIVar14 = (pFVar29->Type_).imagetype_;
        }
        else {
          pIVar14 = Specification::ImageFeatureType::default_instance();
        }
        __return_storage_ptr__ = local_c0;
        std::__cxx11::to_string(&local_e0,pIVar14->height_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,&local_120,&local_e0);
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_148);
        local_170 = (undefined1  [8])local_160;
        puVar24 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_160._0_8_ = *puVar24;
          local_160._8_8_ = puVar11[3];
        }
        else {
          local_160._0_8_ = *puVar24;
          local_170 = (undefined1  [8])*puVar11;
        }
        local_168._M_p = (pointer)puVar11[1];
        *puVar11 = puVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
      }
      if (local_170 != (undefined1  [8])local_160) {
        operator_delete((void *)local_170,(ulong)(local_160._0_8_ + 1));
      }
      if (local_148 != (undefined1  [8])local_138) {
        operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        (ulong)(local_e0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        (ulong)(local_120.field_2._M_allocated_capacity + 1));
      }
      local_b0.field_2._M_allocated_capacity = local_100.field_2._M_allocated_capacity;
      local_b0._M_dataplus._M_p = local_100._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00294add;
    case 5:
      pAVar15 = (pFVar29->Type_).multiarraytype_;
      if (pFVar29->_oneof_case_[0] == 5) {
        pAVar12 = (ArrayFeatureType *)(pFVar29->Type_).int64type_;
      }
      else {
        pAVar12 = Specification::ArrayFeatureType::default_instance();
      }
      iVar9 = (pAVar12->shape_).current_size_;
      local_60 = uVar27;
      if (modelVersion < 3) {
LAB_00294d22:
        bVar8 = false;
      }
      else {
        local_b4 = iVar9;
        if (pFVar29->_oneof_case_[0] == 5) {
          pAVar12 = (pFVar29->Type_).multiarraytype_;
        }
        else {
          pAVar12 = Specification::ArrayFeatureType::default_instance();
        }
        this = &pAVar15->shape_;
        if (pAVar12->_oneof_case_[0] == 0x1f) {
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar15 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar15 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar15->_oneof_case_[0] == 0x1f) {
            pAVar22 = (pAVar15->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar22 = (ArrayFeatureType_EnumeratedShapes *)
                      Specification::ArrayFeatureType_ShapeRange::default_instance();
          }
          local_68 = (SizeRange *)&pAVar22->shapes_;
          if (0 < (pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_) {
            uVar30 = 0;
            local_c0 = __return_storage_ptr__;
            local_70 = pFVar29;
            local_38 = pAVar22;
            do {
              pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                  ((RepeatedPtrFieldBase *)local_68,uVar30);
              validateSizeRange((Result *)local_170,pTVar17);
              bVar8 = Result::good((Result *)local_170);
              if (bVar8) {
                if (local_168._M_p != local_160 + 8) {
                  operator_delete(local_168._M_p,(ulong)(local_160._8_8_ + 1));
                }
              }
              else {
                local_b5 = bVar8;
                std::operator+(&local_b0,"Description of multiarray feature \'",(desc->name_).ptr_);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
                paVar2 = &local_e0.field_2;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_e0.field_2._M_allocated_capacity = *puVar24;
                  local_e0.field_2._8_8_ = puVar11[3];
                  local_e0._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_e0.field_2._M_allocated_capacity = *puVar24;
                  local_e0._M_dataplus._M_p = (pointer)*puVar11;
                }
                local_e0._M_string_length = puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                uVar37 = 1;
                if (9 < uVar30) {
                  uVar27 = (ulong)uVar30;
                  uVar7 = 4;
                  do {
                    uVar37 = uVar7;
                    uVar10 = (uint)uVar27;
                    if (uVar10 < 100) {
                      uVar37 = uVar37 - 2;
                      goto LAB_00295655;
                    }
                    if (uVar10 < 1000) {
                      uVar37 = uVar37 - 1;
                      goto LAB_00295655;
                    }
                    if (uVar10 < 10000) goto LAB_00295655;
                    uVar27 = uVar27 / 10000;
                    uVar7 = uVar37 + 4;
                  } while (99999 < uVar10);
                  uVar37 = uVar37 + 1;
                }
LAB_00295655:
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar37);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_90._M_dataplus._M_p,uVar37,uVar30);
                pFVar29 = local_70;
                uVar34 = (undefined1 *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != paVar2) {
                  uVar34 = local_e0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar34 <
                    (undefined1 *)(local_90._M_string_length + local_e0._M_string_length)) {
                  uVar34 = (undefined1 *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                    uVar34 = local_90.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar34 <
                      (undefined1 *)(local_90._M_string_length + local_e0._M_string_length))
                  goto LAB_002956ea;
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_90,0,(char *)0x0,
                                       (ulong)local_e0._M_dataplus._M_p);
                }
                else {
LAB_002956ea:
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_e0,(ulong)local_90._M_dataplus._M_p);
                }
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_100.field_2._M_allocated_capacity = *puVar24;
                  local_100.field_2._8_8_ = puVar11[3];
                }
                else {
                  local_100.field_2._M_allocated_capacity = *puVar24;
                  local_100._M_dataplus._M_p = (pointer)*puVar11;
                }
                local_100._M_string_length = puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)puVar24 = 0;
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_120.field_2._M_allocated_capacity = *puVar24;
                  local_120.field_2._8_8_ = puVar11[3];
                }
                else {
                  local_120.field_2._M_allocated_capacity = *puVar24;
                  local_120._M_dataplus._M_p = (pointer)*puVar11;
                }
                local_120._M_string_length = puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                psVar16 = Result::message_abi_cxx11_((Result *)local_170);
                puVar11 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_120,(ulong)(psVar16->_M_dataplus)._M_p);
                local_148 = (undefined1  [8])local_138;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_138._0_8_ = *puVar24;
                  local_138._8_8_ = puVar11[3];
                }
                else {
                  local_138._0_8_ = *puVar24;
                  local_148 = (undefined1  [8])*puVar11;
                }
                local_140._M_p = (pointer)puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                Result::Result(local_c0,INVALID_MODEL_INTERFACE,(string *)local_148);
                if (local_148 != (undefined1  [8])local_138) {
                  operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  operator_delete(local_120._M_dataplus._M_p,
                                  (ulong)(local_120.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  (ulong)(local_100.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  (ulong)(local_90.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != paVar2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  (ulong)(local_e0.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  (ulong)(local_b0.field_2._M_allocated_capacity + 1));
                }
                if (local_168._M_p != local_160 + 8) {
                  operator_delete(local_168._M_p,(ulong)(local_160._8_8_ + 1));
                }
                __return_storage_ptr__ = local_c0;
                if (local_b5 == '\0') {
                  return local_c0;
                }
              }
              uVar30 = uVar30 + 1;
              pAVar22 = local_38;
            } while ((int)uVar30 < (local_38->shapes_).super_RepeatedPtrFieldBase.current_size_);
          }
          pSVar32 = local_68;
          bVar8 = true;
          iVar9 = local_b4;
          if (local_b4 != 0) {
            if (this->current_size_ != (pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_)
            {
              std::operator+(&local_b0,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              puVar24 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_e0.field_2._M_allocated_capacity = *puVar24;
                local_e0.field_2._8_8_ = puVar11[3];
              }
              else {
                local_e0.field_2._M_allocated_capacity = *puVar24;
                local_e0._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_e0._M_string_length = puVar11[1];
              *puVar11 = puVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::to_string(&local_90,this->current_size_);
              std::operator+(&local_100,&local_e0,&local_90);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              puVar24 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_120.field_2._M_allocated_capacity = *puVar24;
                local_120.field_2._8_8_ = puVar11[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *puVar24;
                local_120._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_120._M_string_length = puVar11[1];
              *puVar11 = puVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::to_string
                        (&local_58,(pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_148,&local_120,&local_58);
              puVar11 = (undefined8 *)std::__cxx11::string::append(local_148);
              local_170 = (undefined1  [8])local_160;
              puVar24 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_160._0_8_ = *puVar24;
                local_160._8_8_ = puVar11[3];
              }
              else {
                local_160._0_8_ = *puVar24;
                local_170 = (undefined1  [8])*puVar11;
              }
              local_168._M_p = (pointer)puVar11[1];
              *puVar11 = puVar24;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
LAB_00296fa8:
              if (local_170 != (undefined1  [8])local_160) {
                operator_delete((void *)local_170,(ulong)(local_160._0_8_ + 1));
              }
              if (local_148 != (undefined1  [8])local_138) {
                operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                (ulong)(local_58.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                (ulong)(local_120.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                (ulong)(local_100.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,
                                (ulong)(local_90.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,
                                (ulong)(local_e0.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
                return __return_storage_ptr__;
              }
              goto LAB_00294add;
            }
            if (0 < (pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_) {
              iVar9 = 0;
              local_c0 = __return_storage_ptr__;
              local_70 = pFVar29;
              do {
                plVar23 = google::protobuf::RepeatedField<long>::Get(this,iVar9);
                lVar18 = *plVar23;
                pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                    ((RepeatedPtrFieldBase *)pSVar32,iVar9);
                if (lVar18 < (int)pTVar17->lowerbound_) {
LAB_0029680e:
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_148,"Description of multiarray feature \'",
                                 (desc->name_).ptr_);
                  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
                  __return_storage_ptr__ = local_c0;
                  local_170 = (undefined1  [8])local_160;
                  puVar24 = puVar11 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar24) {
                    local_160._0_8_ = *puVar24;
                    local_160._8_8_ = puVar11[3];
                  }
                  else {
                    local_160._0_8_ = *puVar24;
                    local_170 = (undefined1  [8])*puVar11;
                  }
                  local_168._M_p = (pointer)puVar11[1];
                  *puVar11 = puVar24;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  Result::Result(local_c0,INVALID_MODEL_INTERFACE,(string *)local_170);
                  goto LAB_00294ab3;
                }
                pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                    ((RepeatedPtrFieldBase *)pSVar32,iVar9);
                if (-1 < pTVar17->upperbound_) {
                  plVar23 = google::protobuf::RepeatedField<long>::Get(this,iVar9);
                  lVar18 = *plVar23;
                  pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                      ((RepeatedPtrFieldBase *)pSVar32,iVar9);
                  if (pTVar17->upperbound_ < lVar18) goto LAB_0029680e;
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 < (pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_);
              bVar8 = true;
              pFVar29 = local_70;
              __return_storage_ptr__ = local_c0;
              iVar9 = local_b4;
            }
          }
        }
        else {
          iVar9 = local_b4;
          if (pAVar12->_oneof_case_[0] != 0x15) goto LAB_00294d22;
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar15 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar15 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar15->_oneof_case_[0] == 0x15) {
            pAVar22 = (pAVar15->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar22 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
          }
          if ((pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_ == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
            local_170 = (undefined1  [8])local_160;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
            break;
          }
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar15 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar15 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar15->_oneof_case_[0] == 0x15) {
            pAVar22 = (pAVar15->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar22 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
          }
          pRVar6 = (pAVar22->shapes_).super_RepeatedPtrFieldBase.rep_;
          ppvVar25 = pRVar6->elements;
          if (pRVar6 == (Rep *)0x0) {
            ppvVar25 = (void **)0x0;
          }
          lVar18 = (long)(pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar18 != 0) {
            lVar28 = 0;
            do {
              if (*(int *)(*(long *)((long)ppvVar25 + lVar28) + 0x10) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_148,"Description of multiarray feature \'",(desc->name_).ptr_);
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
                local_170 = (undefined1  [8])local_160;
                puVar24 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar24) {
                  local_160._0_8_ = *puVar24;
                  local_160._8_8_ = puVar11[3];
                }
                else {
                  local_160._0_8_ = *puVar24;
                  local_170 = (undefined1  [8])*puVar11;
                }
                local_168._M_p = (pointer)puVar11[1];
                *puVar11 = puVar24;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
                goto LAB_00294ab3;
              }
              lVar28 = lVar28 + 8;
            } while (lVar18 * 8 != lVar28);
          }
          bVar8 = true;
          iVar9 = local_b4;
          if (local_b4 != 0) {
            if (pFVar29->_oneof_case_[0] == 5) {
              pAVar15 = (pFVar29->Type_).multiarraytype_;
            }
            else {
              pAVar15 = Specification::ArrayFeatureType::default_instance();
            }
            if (pAVar15->_oneof_case_[0] == 0x15) {
              pAVar22 = (pAVar15->ShapeFlexibility_).enumeratedshapes_;
            }
            else {
              pAVar22 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
            }
            pRVar6 = (pAVar22->shapes_).super_RepeatedPtrFieldBase.rep_;
            ppvVar25 = pRVar6->elements;
            if (pRVar6 == (Rep *)0x0) {
              ppvVar25 = (void **)0x0;
            }
            lVar18 = (long)(pAVar22->shapes_).super_RepeatedPtrFieldBase.current_size_;
            if (lVar18 != 0) {
              pSVar32 = (SizeRange *)(ppvVar25 + lVar18);
              bVar38 = false;
              local_c0 = __return_storage_ptr__;
              local_70 = pFVar29;
              local_68 = pSVar32;
              do {
                iVar9 = 7;
                if (*(int *)((long)*ppvVar25 + 0x10) == this->current_size_) {
                  this_00 = (RepeatedField<long> *)((long)*ppvVar25 + 0x10);
                  bVar38 = true;
                  if (0 < this_00->current_size_) {
                    iVar9 = 0;
                    do {
                      plVar23 = google::protobuf::RepeatedField<long>::Get(this,iVar9);
                      lVar18 = *plVar23;
                      plVar23 = google::protobuf::RepeatedField<long>::Get(this_00,iVar9);
                      __return_storage_ptr__ = local_c0;
                      pSVar32 = local_68;
                      if (lVar18 != *plVar23) {
                        bVar38 = false;
                        goto LAB_0029672e;
                      }
                      iVar9 = iVar9 + 1;
                    } while (iVar9 < this_00->current_size_);
                    bVar38 = true;
                  }
LAB_0029672e:
                  iVar9 = 0;
                  if (bVar38) {
                    iVar9 = 6;
                  }
                }
              } while (((iVar9 == 7) || (iVar9 == 0)) &&
                      (ppvVar25 = ppvVar25 + 1, (SizeRange *)ppvVar25 != pSVar32));
              bVar8 = true;
              pFVar29 = local_70;
              iVar9 = local_b4;
              if (bVar38) goto LAB_00294d24;
            }
            std::operator+(&local_120,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_138._0_8_ = *puVar24;
              local_138._8_8_ = puVar11[3];
              local_148 = (undefined1  [8])local_138;
            }
            else {
              local_138._0_8_ = *puVar24;
              local_148 = (undefined1  [8])*puVar11;
            }
            local_140._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append(local_148);
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
              local_170 = (undefined1  [8])local_160;
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
            if (local_170 != (undefined1  [8])local_160) {
              operator_delete((void *)local_170,(ulong)(local_160._0_8_ + 1));
            }
            if (local_148 != (undefined1  [8])local_138) {
              operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
            }
            local_b0.field_2._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
            local_b0._M_dataplus._M_p = local_120._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p == &local_120.field_2) {
              return __return_storage_ptr__;
            }
            goto LAB_00294add;
          }
        }
      }
LAB_00294d24:
      if ((!isInput || bVar8) || iVar9 != 0) {
        if (iVar9 != 0) {
          uVar30 = 0;
          while( true ) {
            if (pFVar29->_oneof_case_[0] == 5) {
              pAVar15 = (ArrayFeatureType *)(pFVar29->Type_).int64type_;
            }
            else {
              pAVar15 = Specification::ArrayFeatureType::default_instance();
            }
            if ((pAVar15->shape_).current_size_ <= (int)uVar30) goto LAB_00294ddd;
            if (pFVar29->_oneof_case_[0] == 5) {
              pAVar15 = (pFVar29->Type_).multiarraytype_;
            }
            else {
              pAVar15 = Specification::ArrayFeatureType::default_instance();
            }
            plVar23 = google::protobuf::RepeatedField<long>::Get(&pAVar15->shape_,uVar30);
            lVar18 = *plVar23;
            if (lVar18 < 0) break;
            uVar30 = uVar30 + 1;
          }
          local_c0 = __return_storage_ptr__;
          std::operator+(&local_b0,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
          paVar2 = &local_e0.field_2;
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_e0.field_2._M_allocated_capacity = *puVar24;
            local_e0.field_2._8_8_ = puVar11[3];
            local_e0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *puVar24;
            local_e0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_e0._M_string_length = puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          uVar37 = 1;
          if (9 < uVar30) {
            uVar27 = (ulong)uVar30;
            uVar7 = 4;
            do {
              uVar37 = uVar7;
              uVar10 = (uint)uVar27;
              if (uVar10 < 100) {
                uVar37 = uVar37 - 2;
                goto LAB_00296a86;
              }
              if (uVar10 < 1000) {
                uVar37 = uVar37 - 1;
                goto LAB_00296a86;
              }
              if (uVar10 < 10000) goto LAB_00296a86;
              uVar27 = uVar27 / 10000;
              uVar7 = uVar37 + 4;
            } while (99999 < uVar10);
            uVar37 = uVar37 + 1;
          }
LAB_00296a86:
          paVar3 = &local_90.field_2;
          local_90._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar37);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_90._M_dataplus._M_p,uVar37,uVar30);
          uVar34 = (undefined1 *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            uVar34 = local_e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar34 < (undefined1 *)(local_90._M_string_length + local_e0._M_string_length))
          {
            uVar34 = (undefined1 *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar3) {
              uVar34 = local_90.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar34 <
                (undefined1 *)(local_90._M_string_length + local_e0._M_string_length))
            goto LAB_00296b08;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_90,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
          }
          else {
LAB_00296b08:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_e0,(ulong)local_90._M_dataplus._M_p);
          }
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_100.field_2._M_allocated_capacity = *puVar24;
            local_100.field_2._8_8_ = puVar11[3];
          }
          else {
            local_100.field_2._M_allocated_capacity = *puVar24;
            local_100._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_100._M_string_length = puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)puVar24 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
          paVar1 = &local_120.field_2;
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_120.field_2._M_allocated_capacity = *puVar24;
            local_120.field_2._8_8_ = puVar11[3];
            local_120._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_120.field_2._M_allocated_capacity = *puVar24;
            local_120._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_120._M_string_length = puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          uVar27 = -lVar18;
          uVar30 = 1;
          if (9 < uVar27) {
            uVar26 = uVar27;
            uVar37 = 4;
            do {
              uVar30 = uVar37;
              if (uVar26 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_00296c3a;
              }
              if (uVar26 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_00296c3a;
              }
              if (uVar26 < 10000) goto LAB_00296c3a;
              bVar8 = 99999 < uVar26;
              uVar26 = uVar26 / 10000;
              uVar37 = uVar30 + 4;
            } while (bVar8);
            uVar30 = uVar30 + 1;
          }
LAB_00296c3a:
          paVar4 = &local_58.field_2;
          local_58._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar30 + '\x01');
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_58._M_dataplus._M_p + 1,uVar30,uVar27);
          uVar34 = (undefined1 *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != paVar1) {
            uVar34 = local_120.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar34 < (undefined1 *)(local_58._M_string_length + local_120._M_string_length)
             ) {
            uVar34 = (undefined1 *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != paVar4) {
              uVar34 = local_58.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar34 <
                (undefined1 *)(local_58._M_string_length + local_120._M_string_length))
            goto LAB_00296cb8;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_58,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
          }
          else {
LAB_00296cb8:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_120,(ulong)local_58._M_dataplus._M_p);
          }
          local_148 = (undefined1  [8])local_138;
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_138._0_8_ = *puVar24;
            local_138._8_8_ = puVar11[3];
          }
          else {
            local_138._0_8_ = *puVar24;
            local_148 = (undefined1  [8])*puVar11;
          }
          local_140._M_p = (pointer)puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)puVar24 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_148);
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_160._0_8_ = *puVar24;
            local_160._8_8_ = puVar11[3];
            local_170 = (undefined1  [8])local_160;
          }
          else {
            local_160._0_8_ = *puVar24;
            local_170 = (undefined1  [8])*puVar11;
          }
          local_168._M_p = (pointer)puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          Result::Result(local_c0,INVALID_MODEL_INTERFACE,(string *)local_170);
          if (local_170 != (undefined1  [8])local_160) {
            operator_delete((void *)local_170,(ulong)(local_160._0_8_ + 1));
          }
          if (local_148 != (undefined1  [8])local_138) {
            operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar4) {
            operator_delete(local_58._M_dataplus._M_p,
                            (ulong)(local_58.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != paVar1) {
            operator_delete(local_120._M_dataplus._M_p,
                            (ulong)(local_120.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            (ulong)(local_100.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar3) {
            operator_delete(local_90._M_dataplus._M_p,
                            (ulong)(local_90.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
          __return_storage_ptr__ = local_c0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
            return local_c0;
          }
          goto LAB_00294add;
        }
LAB_00294ddd:
        if (pFVar29->_oneof_case_[0] == 5) {
          pAVar15 = (pFVar29->Type_).multiarraytype_;
        }
        else {
          pAVar15 = Specification::ArrayFeatureType::default_instance();
        }
        iVar9 = pAVar15->datatype_;
        if (0x1003f < iVar9) {
          if ((iVar9 != 0x10040) && (iVar9 != 0x20020)) {
LAB_002951f7:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
            local_170 = (undefined1  [8])local_160;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
            break;
          }
LAB_00295f51:
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar15 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar15 = Specification::ArrayFeatureType::default_instance();
          }
          uVar5 = pAVar15->_oneof_case_[1];
          if (uVar5 == 0x29) {
            if (pFVar29->_oneof_case_[0] == 5) {
              pAVar15 = (pFVar29->Type_).multiarraytype_;
            }
            else {
              pAVar15 = Specification::ArrayFeatureType::default_instance();
            }
            if (pAVar15->datatype_ == 0x20020) goto switchD_00294994_caseD_1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
            local_170 = (undefined1  [8])local_160;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
          }
          else if (uVar5 == 0x33) {
            if (pFVar29->_oneof_case_[0] == 5) {
              pAVar15 = (pFVar29->Type_).multiarraytype_;
            }
            else {
              pAVar15 = Specification::ArrayFeatureType::default_instance();
            }
            if (pAVar15->datatype_ == 0x10020) goto switchD_00294994_caseD_1;
            if (pFVar29->_oneof_case_[0] == 5) {
              pAVar15 = (pFVar29->Type_).multiarraytype_;
            }
            else {
              pAVar15 = Specification::ArrayFeatureType::default_instance();
            }
            if (pAVar15->datatype_ == 0x10010) goto switchD_00294994_caseD_1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
            local_170 = (undefined1  [8])local_160;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
          }
          else {
            if (uVar5 != 0x3d) goto switchD_00294994_caseD_1;
            if (pFVar29->_oneof_case_[0] == 5) {
              pAVar15 = (pFVar29->Type_).multiarraytype_;
            }
            else {
              pAVar15 = Specification::ArrayFeatureType::default_instance();
            }
            if (pAVar15->datatype_ == 0x10040) goto switchD_00294994_caseD_1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
            local_170 = (undefined1  [8])local_160;
            puVar24 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_160._0_8_ = *puVar24;
              local_160._8_8_ = puVar11[3];
            }
            else {
              local_160._0_8_ = *puVar24;
              local_170 = (undefined1  [8])*puVar11;
            }
            local_168._M_p = (pointer)puVar11[1];
            *puVar11 = puVar24;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
          }
          break;
        }
        if (iVar9 != 0x10010) {
          if (iVar9 != 0x10020) goto LAB_002951f7;
          goto LAB_00295f51;
        }
        iVar9 = (int)local_60;
        if (6 < iVar9) goto LAB_00295f51;
        std::__cxx11::to_string(&local_120,7);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_148 = (undefined1  [8])local_138;
        puVar24 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_138._0_8_ = *puVar24;
          local_138._8_8_ = puVar11[3];
        }
        else {
          local_138._0_8_ = *puVar24;
          local_148 = (undefined1  [8])*puVar11;
        }
        local_140._M_p = (pointer)puVar11[1];
        *puVar11 = puVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::to_string(&local_100,iVar9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,&local_100);
        std::operator+(&local_b0,"Description of multiarray feature \'",(desc->name_).ptr_);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        puVar24 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_e0.field_2._M_allocated_capacity = *puVar24;
          local_e0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar24;
          local_e0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_e0._M_string_length = puVar11[1];
        *puVar11 = puVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        psVar16 = (string *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_170);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar16);
LAB_002973c0:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          (ulong)(local_b0.field_2._M_allocated_capacity + 1));
        }
        if (local_170 != (undefined1  [8])local_160) {
          operator_delete((void *)local_170,(ulong)(local_160._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          (ulong)(local_100.field_2._M_allocated_capacity + 1));
        }
        if (local_148 != (undefined1  [8])local_138) {
          operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
        }
        local_b0.field_2._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
        local_b0._M_dataplus._M_p = local_120._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p == &local_120.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_00294add;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     "Description of multiarray feature \'",(desc->name_).ptr_);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
      local_170 = (undefined1  [8])local_160;
      puVar24 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_160._0_8_ = *puVar24;
        local_160._8_8_ = puVar11[3];
      }
      else {
        local_160._0_8_ = *puVar24;
        local_170 = (undefined1  [8])*puVar11;
      }
      local_168._M_p = (pointer)puVar11[1];
      *puVar11 = puVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
      break;
    case 6:
      if (*(int *)((long)&(((pFVar29->Type_).multiarraytype_)->shape_).rep_ + 4) != 0)
      goto switchD_00294994_caseD_1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     "Description of dictionary feature \'",(desc->name_).ptr_);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_148);
      local_170 = (undefined1  [8])local_160;
      puVar24 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_160._0_8_ = *puVar24;
        local_160._8_8_ = puVar11[3];
      }
      else {
        local_160._0_8_ = *puVar24;
        local_170 = (undefined1  [8])*puVar11;
      }
      local_168._M_p = (pointer)puVar11[1];
      *puVar11 = puVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
      break;
    case 7:
      if (2 < modelVersion) {
        if (pFVar29->_oneof_case_[0] == 7) {
          pSVar13 = (pFVar29->Type_).sequencetype_;
        }
        else {
          pSVar13 = Specification::SequenceFeatureType::default_instance();
        }
        pSVar32 = pSVar13->sizerange_;
        if (pSVar32 == (SizeRange *)0x0) {
          pSVar32 = (SizeRange *)&Specification::_SizeRange_default_instance_;
        }
        validateSizeRange((Result *)local_170,pSVar32);
        bVar8 = Result::good((Result *)local_170);
        if (bVar8) {
          if (pFVar29->_oneof_case_[0] == 7) {
            pAVar15 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar15 = (ArrayFeatureType *)Specification::SequenceFeatureType::default_instance();
          }
          if (pAVar15->datatype_ != 0) {
            if (local_168._M_p != local_160 + 8) {
              operator_delete(local_168._M_p,(ulong)(local_160._8_8_ + 1));
            }
            goto switchD_00294994_caseD_1;
          }
          std::operator+(&local_120,"Description of sequence feature \'",(desc->name_).ptr_);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_138._0_8_ = *puVar24;
            local_138._8_8_ = puVar11[3];
            local_148 = (undefined1  [8])local_138;
          }
          else {
            local_138._0_8_ = *puVar24;
            local_148 = (undefined1  [8])*puVar11;
          }
          local_140._M_p = (pointer)puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_148);
          if (local_148 != (undefined1  [8])local_138) {
            operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
          }
          uVar34 = local_120.field_2._M_allocated_capacity;
          _Var35._M_p = local_120._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) goto LAB_002962d2;
        }
        else {
          std::operator+(&local_100,"Description of sequence feature \'",(desc->name_).ptr_);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
          puVar24 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_120.field_2._M_allocated_capacity = *puVar24;
            local_120.field_2._8_8_ = puVar11[3];
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          }
          else {
            local_120.field_2._M_allocated_capacity = *puVar24;
            local_120._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_120._M_string_length = puVar11[1];
          *puVar11 = puVar24;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          psVar16 = Result::message_abi_cxx11_((Result *)local_170);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,&local_120,psVar16);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_148);
          if (local_148 != (undefined1  [8])local_138) {
            operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,
                            (ulong)(local_120.field_2._M_allocated_capacity + 1));
          }
          uVar34 = local_100.field_2._M_allocated_capacity;
          _Var35._M_p = local_100._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
LAB_002962d2:
            operator_delete(_Var35._M_p,(ulong)(uVar34 + 1));
          }
        }
        local_b0.field_2._M_allocated_capacity = local_160._8_8_;
        local_b0._M_dataplus._M_p = local_168._M_p;
        if (local_168._M_p == local_160 + 8) {
          return __return_storage_ptr__;
        }
        goto LAB_00294add;
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_100,'\x01');
      *local_100._M_dataplus._M_p = '3';
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x35af63);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      puVar24 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_120.field_2._M_allocated_capacity = *puVar24;
        local_120.field_2._8_8_ = puVar11[3];
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar24;
        local_120._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_120._M_string_length = puVar11[1];
      *puVar11 = puVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
      puVar24 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_138._0_8_ = *puVar24;
        local_138._8_8_ = puVar11[3];
        local_148 = (undefined1  [8])local_138;
      }
      else {
        local_138._0_8_ = *puVar24;
        local_148 = (undefined1  [8])*puVar11;
      }
      local_140._M_p = (pointer)puVar11[1];
      *puVar11 = puVar24;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      uVar30 = -modelVersion;
      if (0 < modelVersion) {
        uVar30 = modelVersion;
      }
      uVar37 = 1;
      if (9 < uVar30) {
        uVar27 = (ulong)uVar30;
        uVar7 = 4;
        do {
          uVar37 = uVar7;
          uVar10 = (uint)uVar27;
          if (uVar10 < 100) {
            uVar37 = uVar37 - 2;
            goto LAB_00295cc3;
          }
          if (uVar10 < 1000) {
            uVar37 = uVar37 - 1;
            goto LAB_00295cc3;
          }
          if (uVar10 < 10000) goto LAB_00295cc3;
          uVar27 = uVar27 / 10000;
          uVar7 = uVar37 + 4;
        } while (99999 < uVar10);
        uVar37 = uVar37 + 1;
      }
LAB_00295cc3:
      paVar2 = &local_e0.field_2;
      local_e0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_e0,(char)uVar37 - (char)(modelVersion >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_e0._M_dataplus._M_p + ((uint)modelVersion >> 0x1f),uVar37,uVar30);
      pcVar33 = (pointer)0xf;
      if (local_148 != (undefined1  [8])local_138) {
        pcVar33 = (pointer)local_138._0_8_;
      }
      if (pcVar33 < local_140._M_p + local_e0._M_string_length) {
        uVar34 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar2) {
          uVar34 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < local_140._M_p + local_e0._M_string_length) goto LAB_00295d43;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_148);
      }
      else {
LAB_00295d43:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_148,(ulong)local_e0._M_dataplus._M_p);
      }
      local_170 = (undefined1  [8])local_160;
      puVar24 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_160._0_8_ = *puVar24;
        local_160._8_8_ = puVar11[3];
      }
      else {
        local_160._0_8_ = *puVar24;
        local_170 = (undefined1  [8])*puVar11;
      }
      local_168._M_p = (pointer)puVar11[1];
      *puVar11 = puVar24;
      puVar11[1] = 0;
      *(undefined1 *)puVar24 = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_170);
      if (local_170 != (undefined1  [8])local_160) {
        operator_delete((void *)local_170,(ulong)(local_160._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        (ulong)(local_e0.field_2._M_allocated_capacity + 1));
      }
      if (local_148 != (undefined1  [8])local_138) {
        operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        (ulong)(local_120.field_2._M_allocated_capacity + 1));
      }
      local_b0.field_2._M_allocated_capacity = local_100.field_2._M_allocated_capacity;
      local_b0._M_dataplus._M_p = local_100._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00294add;
    }
  }
LAB_00294ab3:
  if (local_170 != (undefined1  [8])local_160) {
    operator_delete((void *)local_170,(ulong)(local_160._0_8_ + 1));
  }
  local_b0.field_2._M_allocated_capacity = local_138._0_8_;
  local_b0._M_dataplus._M_p = (pointer)local_148;
  if (local_148 == (undefined1  [8])local_138) {
    return __return_storage_ptr__;
  }
LAB_00294add:
  operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescription(const Specification::FeatureDescription& desc, int modelVersion, bool isInput) {
        if (desc.name() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description must have a non-empty name.");
        }

        if (!desc.has_type()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description " + desc.name() + " must specify a valid feature type.");
        }

        const auto& type = desc.type();
        switch (type.Type_case()) {
            case Specification::FeatureType::kDoubleType:
            case Specification::FeatureType::kInt64Type:
            case Specification::FeatureType::kStringType:
                // in general, non-parametric types need no further validation
                break;

            case Specification::FeatureType::kMultiArrayType:
            {
                const auto &defaultShape = type.multiarraytype().shape();
                bool hasExplicitDefault = (type.multiarraytype().shape_size() != 0);
                bool hasImplictDefault = false;
                // Newer versions use the updated shape constraints for images and multi-arrays
                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.multiarraytype().ShapeFlexibility_case()) {

                        case Specification::ArrayFeatureType::kEnumeratedShapes: {

                            hasImplictDefault = true;

                            if (type.multiarraytype().enumeratedshapes().shapes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() == 0) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() + "' has enumerated shapes with zero dimensions.");
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() != defaultShape.size()) { continue; }
                                foundDefault = true;
                                for (int d = 0; d < shape.shape_size(); d++) {
                                    if (defaultShape[d] != shape.shape(d)) { foundDefault = false; break; }
                                }
                                if (foundDefault) { break; }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has a default shape specified " +
                                              " which is not within the allowed enumerated shapes specified.");
                            }

                            break;
                        }
                        case Specification::ArrayFeatureType::kShapeRange: {

                            hasImplictDefault = true;

                            const auto& sizeRanges = type.multiarraytype().shaperange().sizeranges();
                            for (int i = 0; i < sizeRanges.size(); i++) {
                                const auto &range = sizeRanges[i];
                                Result res = validateSizeRange(range);
                                if (!res.good()) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() +
                                                  "' has an invalid range for dimension " + std::to_string(i) + ". " +
                                                  res.message());
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            // Check if default is compatible
                            if (defaultShape.size() != sizeRanges.size()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() +
                                              "' has a default " + std::to_string(defaultShape.size()) + "-d shape but a " +
                                              std::to_string(sizeRanges.size()) + "-d shape range");
                            }

                             for (int i = 0; i < sizeRanges.size(); i++) {
                                 if (defaultShape[i] < (int)sizeRanges[i].lowerbound() ||
                                     (sizeRanges[i].upperbound() >= 0 && defaultShape[i] > sizeRanges[i].upperbound())) {

                                     return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                   "Description of multiarray feature '" + desc.name() +
                                                   "' has a default shape that is out of the specified shape range");
                                 }
                             }

                            break;
                        }
                        case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                            break;
                    }

                }

                if (isInput && !hasExplicitDefault && !hasImplictDefault) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of multiarray feature '" + desc.name() + "' has missing shape constraints.");
                }

                if (hasExplicitDefault) {
                    for (int i=0; i < type.multiarraytype().shape_size(); i++) {
                        const auto &value = type.multiarraytype().shape(i);
                        if (value < 0) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has an invalid shape. "
                                          "Element " + std::to_string(i) + " has non-positive value " + std::to_string(value) + ".");
                        }
                    }
                }

                switch (type.multiarraytype().datatype()) {
                    case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                    case Specification::ArrayFeatureType_ArrayDataType_INT32:
                        break;
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() +
                                          "' has FLOAT16 dataType, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }

                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of multiarray feature '" + desc.name() + "' has an invalid or unspecified dataType. "
                                      "It must be specified as DOUBLE, FLOAT32, FLOAT16 or INT32");
                }

                switch (type.multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_DOUBLE){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32 &&
                            type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT16){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_INT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    default:
                        break;
                }
                
                break;

            }
            case Specification::FeatureType::kDictionaryType:
                switch (type.dictionarytype().KeyType_case()) {
                    case Specification::DictionaryFeatureType::KeyTypeCase::kInt64KeyType:
                    case Specification::DictionaryFeatureType::KeyTypeCase::kStringKeyType:
                        break;
                    case Specification::DictionaryFeatureType::KeyTypeCase::KEYTYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of dictionary feature '" + desc.name() + "' must contain a key type of either Int64 or String.");
                }
                break;

            case Specification::FeatureType::kImageType: {

                int64_t defaultWidth = type.imagetype().width();
                int64_t defaultHeight = type.imagetype().height();
                bool hasDefault = (defaultWidth > 0 && defaultHeight > 0);

                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.imagetype().SizeFlexibility_case()) {

                        case Specification::ImageFeatureType::kEnumeratedSizes: {

                            if (type.imagetype().enumeratedsizes().sizes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)type.imagetype().enumeratedsizes().sizes(0).width();
                                defaultHeight = (int64_t)type.imagetype().enumeratedsizes().sizes(0).height();
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &size : type.imagetype().enumeratedsizes().sizes()) {
                                if (defaultWidth == (int64_t)size.width() && defaultHeight == (int64_t)size.height()) {
                                    foundDefault = true;
                                    break;
                                }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has a default size of " +
                                              std::to_string(defaultWidth) + " × " + std::to_string(defaultHeight) +
                                              " which is not within the allowed enumerated sizes specified.");
                            }

                            break;
                        }
                        case Specification::ImageFeatureType::kImageSizeRange:
                        {
                            const auto& widthRange = type.imagetype().imagesizerange().widthrange();
                            Result res = validateSizeRange(widthRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible width range. "
                                               + res.message());
                            }

                            const auto& heightRange = type.imagetype().imagesizerange().heightrange();
                            res = validateSizeRange(heightRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible height range. "
                                              + res.message());
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)widthRange.lowerbound();
                                defaultHeight = (int64_t)heightRange.lowerbound();
                                break;
                            }

                            if (defaultWidth < (int64_t)widthRange.lowerbound() ||
                                (widthRange.upperbound() >=0 && defaultWidth > widthRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default width "
                                              + std::to_string(defaultWidth) + " is not within specified flexible width range");
                            }

                            if (defaultHeight < (int64_t)heightRange.lowerbound() ||
                                (heightRange.upperbound() >=0 && defaultHeight > heightRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default height "
                                              + std::to_string(defaultHeight) + " is not within specified flexible height range");
                            }


                            break;
                        }
                        default:
                            break;
                    }

                }

                if (defaultWidth <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive width " + std::to_string(type.imagetype().width()) + ".");
                }

                if (defaultHeight <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive height " + std::to_string(type.imagetype().height()) + ".");
                }

                switch (type.imagetype().colorspace()) {
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE:
                    case Specification::ImageFeatureType_ColorSpace_RGB:
                    case Specification::ImageFeatureType_ColorSpace_BGR:
                        break;
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of image feature '" + desc.name() +
                                          "' has GRAYSCALE_FLOAT16 colorspace, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of image feature '" + desc.name() +
                                      "' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
                }
                break;
            }
            case Specification::FeatureType::kSequenceType: {

                if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS12) {
                    return  Result(ResultType::INVALID_MODEL_INTERFACE,
                                   "Sequence types are only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS12)+
                                   ". This model has version " + std::to_string(modelVersion));
                }

                // Validate size
                Result res = validateSizeRange(type.sequencetype().sizerange());
                if (!res.good()) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of sequence feature '" + desc.name() + "' has invalid allowed sizes. "
                                  + res.message());
                }

                // Validate type

                switch (type.sequencetype().Type_case()) {
                    case Specification::SequenceFeatureType::kInt64Type:
                    case Specification::SequenceFeatureType::kStringType:
                        break;
                    case Specification::SequenceFeatureType::TYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of sequence feature '" + desc.name() + "' has invalid or missing type. "
                                      "Only Int64 and String sequences are currently supported");


                }
                break;
            }
            case Specification::FeatureType::TYPE_NOT_SET:
                // these aren't equal to anything, even themselves
                return Result(ResultType::INVALID_MODEL_INTERFACE,
                              "Feature description has an unspecified or invalid type for feature '" + desc.name() + "'.");
        }

        // If we got here, the feature description is valid.
        return Result();
    }